

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closure.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  VMStd vm;
  string local_90;
  VM local_70;
  
  squall::VMStd::VMStd((VMStd *)&local_70,0x400);
  squall::VMStd::dofile((VMStd *)&local_70,"closure.nut");
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"foo","");
  squall::TableBase::
  defun<void(*)(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>
            ((TableBase *)
             local_70.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_90,foo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bar","");
  iVar2 = squall::TableBase::call<int>
                    ((TableBase *)
                     local_70.root_table_._M_t.
                     super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>
                     .super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"**** return value: ",0x13);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  squall::VM::~VM(&local_70);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("closure.nut");

        vm.defun("foo", &foo);
        int n = vm.call<int>("bar");
        std::cout << "**** return value: " << n << std::endl;
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}